

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

grp_stack_item * grp_stack_append(grp_stack_item *last,grp_stack_data data)

{
  grp_stack_item *pgVar1;
  grp_stack_data in_RSI;
  grp_stack_item_struct *in_RDI;
  grp_stack_item *new_item;
  
  pgVar1 = (grp_stack_item *)malloc(0x18);
  pgVar1->data = in_RSI;
  if (in_RDI == (grp_stack_item_struct *)0x0) {
    pgVar1->next = pgVar1;
    pgVar1->prev = pgVar1;
  }
  else {
    pgVar1->next = in_RDI->next;
    pgVar1->prev = in_RDI;
    in_RDI->next->prev = pgVar1;
    in_RDI->next = pgVar1;
  }
  return pgVar1;
}

Assistant:

static grp_stack_item* grp_stack_append(
  grp_stack_item* last, grp_stack_data data
) {
  /* first create a new stack item, and copy data to it */
  grp_stack_item* new_item = (grp_stack_item*) malloc(sizeof(grp_stack_item));
  new_item->data = data;
  if(last) {
    /* attach this item between the "last" item and its "next" item */
    new_item->next = last->next;
    new_item->prev = last;
    last->next->prev = new_item;
    last->next = new_item;
  } else {
    /* stack is empty, so "next" and "previous" both point back to it */
    new_item->next = new_item;
    new_item->prev = new_item;
  }
  return new_item;
}